

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token)

{
  char *pcVar1;
  char *pcVar2;
  Value *pVVar3;
  Value local_288;
  Value local_278;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  Value local_200;
  allocator<char> local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char local_b1;
  UInt UStack_b0;
  Char c;
  int64_t value;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  char *pcStack_28;
  bool isNegative;
  Location current;
  Token *token_local;
  Reader *this_local;
  
  pcStack_28 = token->start_;
  local_29 = *pcStack_28 == '-';
  if ((bool)local_29) {
    pcStack_28 = pcStack_28 + 1;
  }
  current = (Location)token;
  token_local = (Token *)this;
  if (pcStack_28 == token->end_) {
    pcVar1 = token->start_;
    pcVar2 = token->end_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>((string *)&local_90,pcVar1,pcVar2,&local_91);
    std::operator+(&local_70,"\'",&local_90);
    std::operator+(&local_50,&local_70,"\' is not a valid number.");
    this_local._7_1_ = addError(this,&local_50,(Token *)current,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  else {
    for (_UStack_b0 = 0; pcStack_28 < token->end_ && _UStack_b0 < 0x100000000;
        _UStack_b0 = _UStack_b0 * 10 + (long)(local_b1 + -0x30)) {
      local_b1 = *pcStack_28;
      if ((local_b1 < '0') || ('9' < local_b1)) {
        pcVar1 = token->start_;
        pcVar2 = token->end_;
        pcStack_28 = pcStack_28 + 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  ((string *)&local_118,pcVar1,pcVar2,&local_119);
        std::operator+(&local_f8,"\'",&local_118);
        std::operator+(&local_d8,&local_f8,"\' is not a number.");
        this_local._7_1_ = addError(this,&local_d8,(Token *)current,(Location)0x0);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        goto LAB_0031317a;
      }
      pcStack_28 = pcStack_28 + 1;
    }
    if (pcStack_28 == token->end_) {
      if ((bool)local_29) {
        _UStack_b0 = -_UStack_b0;
        if ((_UStack_b0 < -0x80000000) || (0x7fffffff < _UStack_b0)) {
          pcVar1 = token->start_;
          pcVar2 = token->end_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    ((string *)&local_1e8,pcVar1,pcVar2,&local_1e9);
          std::operator+(&local_1c8,"\'",&local_1e8);
          std::operator+(&local_1a8,&local_1c8,"\' exceeds the allowable range.");
          this_local._7_1_ = addError(this,&local_1a8,(Token *)current,(Location)0x0);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator(&local_1e9);
          goto LAB_0031317a;
        }
        Value::Value(&local_200,UStack_b0);
        pVVar3 = currentValue(this);
        Value::operator=(pVVar3,&local_200);
        Value::~Value(&local_200);
      }
      else {
        if (0xffffffff < _UStack_b0) {
          pcVar1 = token->start_;
          pcVar2 = token->end_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<char_const*,void>
                    ((string *)&local_260,pcVar1,pcVar2,&local_261);
          std::operator+(&local_240,"\'",&local_260);
          std::operator+(&local_220,&local_240,"\' exceeds the allowable range.");
          this_local._7_1_ = addError(this,&local_220,(Token *)current,(Location)0x0);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
          goto LAB_0031317a;
        }
        if (_UStack_b0 < 0x80000000) {
          Value::Value(&local_278,UStack_b0);
          pVVar3 = currentValue(this);
          Value::operator=(pVVar3,&local_278);
          Value::~Value(&local_278);
        }
        else {
          Value::Value(&local_288,UStack_b0);
          pVVar3 = currentValue(this);
          Value::operator=(pVVar3,&local_288);
          Value::~Value(&local_288);
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      pcVar1 = token->start_;
      pcVar2 = token->end_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>((string *)&local_180,pcVar1,pcVar2,&local_181);
      std::operator+(&local_160,"\'",&local_180);
      std::operator+(&local_140,&local_160,"\' exceeds the allowable range.");
      this_local._7_1_ = addError(this,&local_140,(Token *)current,(Location)0x0);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
    }
  }
LAB_0031317a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
Reader::decodeNumber ( Token& token )
{
    Location current = token.start_;
    bool isNegative = *current == '-';

    if ( isNegative )
        ++current;

    if (current == token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' is not a valid number.", token );
    }

    // The existing Json integers are 32-bit so using a 64-bit value here avoids
    // overflows in the conversion code below.
    std::int64_t value = 0;

    static_assert(sizeof(value) > sizeof(Value::maxUInt),
        "The JSON integer overflow logic will need to be reworked.");

    while (current < token.end_ && (value <= Value::maxUInt))
    {
        Char c = *current++;

        if ( c < '0'  ||  c > '9' )
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' is not a number.", token );
        }

        value = (value * 10) + (c - '0');
    }

    // More tokens left -> input is larger than largest possible return value
    if (current != token.end_)
    {
        return addError ( "'" + std::string ( token.start_, token.end_ ) +
            "' exceeds the allowable range.", token );
    }

    if ( isNegative )
    {
        value = -value;

        if (value < Value::minInt || value > Value::maxInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        currentValue () = static_cast<Value::Int>( value );
    }
    else
    {
        if (value > Value::maxUInt)
        {
            return addError ( "'" + std::string ( token.start_, token.end_ ) +
                "' exceeds the allowable range.", token );
        }

        // If it's representable as a signed integer, construct it as one.
        if ( value <= Value::maxInt )
            currentValue () = static_cast<Value::Int>( value );
        else
            currentValue () = static_cast<Value::UInt>( value );
    }

    return true;
}